

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

int8_t getStateProp(int32_t (*stateTable) [256],int8_t *stateProps,int state)

{
  uint uVar1;
  int8_t in_AL;
  byte bVar2;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar3;
  
  uVar6 = (ulong)(uint)state;
  stateProps[uVar6] = '\0';
  uVar4 = 0;
  do {
    uVar1 = stateTable[uVar6][uVar4];
    uVar7 = uVar1 >> 0x18 & 0x7f;
    if (stateProps[uVar7] == -1) {
      in_AL = getStateProp(stateTable,stateProps,uVar7);
    }
    if ((int)uVar1 < 0) {
      if ((uVar1 & 0xe00000) < 0x600000) goto LAB_002c5451;
    }
    else if (-1 < stateProps[uVar7]) {
LAB_002c5451:
      bVar2 = (byte)(uVar4 >> 2) & 0xf8 | stateProps[uVar6];
      stateProps[uVar6] = bVar2;
      uVar5 = 0xff;
      if (0xfe < uVar4) goto LAB_002c54d8;
      uVar5 = 0xff;
      break;
    }
    if (uVar4 == 0xff) {
      stateProps[uVar6] = -0x40;
      return in_AL;
    }
    uVar4 = uVar4 + 1;
  } while( true );
  do {
    uVar1 = stateTable[uVar6][uVar5];
    uVar7 = uVar1 >> 0x18 & 0x7f;
    if (stateProps[uVar7] == -1) {
      getStateProp(stateTable,stateProps,uVar7);
    }
    if ((int)uVar1 < 0) {
      if ((uVar1 & 0xe00000) < 0x600000) goto LAB_002c54d4;
    }
    else if (-1 < stateProps[uVar7]) goto LAB_002c54d4;
    uVar5 = uVar5 - 1;
  } while (uVar4 < uVar5);
  uVar5 = uVar4 & 0xffffffff;
LAB_002c54d4:
  bVar2 = stateProps[uVar6];
LAB_002c54d8:
  uVar3 = (ulong)bVar2;
  stateProps[uVar6] = (byte)(uVar5 >> 5) | bVar2;
  if ((int)uVar4 <= (int)uVar5) {
    if ((int)uVar5 <= (int)uVar4) {
      uVar5 = uVar4;
    }
    do {
      uVar1 = stateTable[uVar6][uVar4];
      uVar7 = uVar1 >> 0x18 & 0x7f;
      if (stateProps[uVar7] == -1) {
        bVar2 = getStateProp(stateTable,stateProps,uVar7);
        uVar3 = (ulong)bVar2;
      }
      if (((int)uVar1 < 0) &&
         (stateProps[uVar7] = stateProps[uVar7] | 0x40, (uVar1 & 0xc00000) == 0)) {
        stateProps[uVar6] = stateProps[uVar6] | 0x40;
        uVar3 = uVar6;
      }
      bVar2 = (byte)uVar3;
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0xffffffff) + 1 != uVar4);
  }
  return bVar2;
}

Assistant:

static int8_t
getStateProp(const int32_t (*stateTable)[256], int8_t stateProps[], int state) {
    const int32_t *row;
    int32_t min, max, entry, nextState;

    row=stateTable[state];
    stateProps[state]=0;

    /* find first non-ignorable state */
    for(min=0;; ++min) {
        entry=row[min];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(stateProps[nextState]>=0) {
                break;
            }
        } else if(MBCS_ENTRY_FINAL_ACTION(entry)<MBCS_STATE_UNASSIGNED) {
            break;
        }
        if(min==0xff) {
            stateProps[state]=-0x40;  /* (int8_t)0xc0 */
            return stateProps[state];
        }
    }
    stateProps[state]|=(int8_t)((min>>5)<<3);

    /* find last non-ignorable state */
    for(max=0xff; min<max; --max) {
        entry=row[max];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(stateProps[nextState]>=0) {
                break;
            }
        } else if(MBCS_ENTRY_FINAL_ACTION(entry)<MBCS_STATE_UNASSIGNED) {
            break;
        }
    }
    stateProps[state]|=(int8_t)(max>>5);

    /* recurse further and collect direct-state information */
    while(min<=max) {
        entry=row[min];
        nextState=MBCS_ENTRY_STATE(entry);
        if(stateProps[nextState]==-1) {
            getStateProp(stateTable, stateProps, nextState);
        }
        if(MBCS_ENTRY_IS_FINAL(entry)) {
            stateProps[nextState]|=0x40;
            if(MBCS_ENTRY_FINAL_ACTION(entry)<=MBCS_STATE_FALLBACK_DIRECT_20) {
                stateProps[state]|=0x40;
            }
        }
        ++min;
    }
    return stateProps[state];
}